

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# staj_event.hpp
# Opt level: O3

basic_ostream<char,_std::char_traits<char>_> *
jsoncons::operator<<(basic_ostream<char,_std::char_traits<char>_> *os,staj_event_type tag)

{
  long lVar1;
  undefined7 in_register_00000031;
  char *pcVar2;
  
  switch(CONCAT71(in_register_00000031,tag) & 0xffffffff) {
  case 0:
    pcVar2 = "key";
    lVar1 = 3;
    break;
  case 1:
    pcVar2 = "string_value";
    goto LAB_001f4aa2;
  case 2:
    pcVar2 = "byte_string_value";
    lVar1 = 0x11;
    break;
  case 3:
    pcVar2 = "null_value";
    goto LAB_001f4ab0;
  case 4:
    pcVar2 = "bool_value";
    goto LAB_001f4ab0;
  case 5:
    pcVar2 = "int64_value";
    goto LAB_001f4a62;
  case 6:
    pcVar2 = "uint64_value";
    goto LAB_001f4aa2;
  case 7:
    pcVar2 = "end_object";
    goto LAB_001f4ab0;
  case 8:
    pcVar2 = "half_value";
LAB_001f4ab0:
    lVar1 = 10;
    break;
  case 9:
    pcVar2 = "double_value";
    goto LAB_001f4aa2;
  default:
    goto switchD_001f4a1f_caseD_a;
  case 0xd:
    pcVar2 = "begin_object";
LAB_001f4aa2:
    lVar1 = 0xc;
    break;
  case 0xe:
    pcVar2 = "begin_array";
LAB_001f4a62:
    lVar1 = 0xb;
    break;
  case 0xf:
    pcVar2 = "end_array";
    lVar1 = 9;
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,pcVar2,lVar1);
switchD_001f4a1f_caseD_a:
  return os;
}

Assistant:

std::basic_ostream<CharT>& operator<<(std::basic_ostream<CharT>& os, staj_event_type tag)
{
    static constexpr const CharT* begin_array_name = JSONCONS_CSTRING_CONSTANT(CharT, "begin_array");
    static constexpr const CharT* end_array_name = JSONCONS_CSTRING_CONSTANT(CharT, "end_array");
    static constexpr const CharT* begin_object_name = JSONCONS_CSTRING_CONSTANT(CharT, "begin_object");
    static constexpr const CharT* end_object_name = JSONCONS_CSTRING_CONSTANT(CharT, "end_object");
    static constexpr const CharT* key_name = JSONCONS_CSTRING_CONSTANT(CharT, "key");
    static constexpr const CharT* string_value_name = JSONCONS_CSTRING_CONSTANT(CharT, "string_value");
    static constexpr const CharT* byte_string_value_name = JSONCONS_CSTRING_CONSTANT(CharT, "byte_string_value");
    static constexpr const CharT* null_value_name = JSONCONS_CSTRING_CONSTANT(CharT, "null_value");
    static constexpr const CharT* bool_value_name = JSONCONS_CSTRING_CONSTANT(CharT, "bool_value");
    static constexpr const CharT* uint64_value_name = JSONCONS_CSTRING_CONSTANT(CharT, "uint64_value");
    static constexpr const CharT* int64_value_name = JSONCONS_CSTRING_CONSTANT(CharT, "int64_value");
    static constexpr const CharT* half_value_name = JSONCONS_CSTRING_CONSTANT(CharT, "half_value");
    static constexpr const CharT* double_value_name = JSONCONS_CSTRING_CONSTANT(CharT, "double_value");

    switch (tag)
    {
        case staj_event_type::begin_array:
        {
            os << begin_array_name;
            break;
        }
        case staj_event_type::end_array:
        {
            os << end_array_name;
            break;
        }
        case staj_event_type::begin_object:
        {
            os << begin_object_name;
            break;
        }
        case staj_event_type::end_object:
        {
            os << end_object_name;
            break;
        }
        case staj_event_type::key:
        {
            os << key_name;
            break;
        }
        case staj_event_type::string_value:
        {
            os << string_value_name;
            break;
        }
        case staj_event_type::byte_string_value:
        {
            os << byte_string_value_name;
            break;
        }
        case staj_event_type::null_value:
        {
            os << null_value_name;
            break;
        }
        case staj_event_type::bool_value:
        {
            os << bool_value_name;
            break;
        }
        case staj_event_type::int64_value:
        {
            os << int64_value_name;
            break;
        }
        case staj_event_type::uint64_value:
        {
            os << uint64_value_name;
            break;
        }
        case staj_event_type::half_value:
        {
            os << half_value_name;
            break;
        }
        case staj_event_type::double_value:
        {
            os << double_value_name;
            break;
        }
    }
    return os;
}